

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  int *piVar1;
  int iVar2;
  ImFont *this_00;
  ImFont **__dest;
  ImFontConfig *pIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  void *__dest_00;
  int iVar6;
  long lVar7;
  char *__function;
  int iVar8;
  ImFontConfig *pIVar9;
  ImFont **ppIVar10;
  byte bVar11;
  
  pIVar4 = GImGui;
  bVar11 = 0;
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x46d,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->SizePixels <= 0.0) {
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x46e,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->MergeMode == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_00 = (ImFont *)(*(pIVar4->IO).MemAllocFn)(0x68);
    ImFont::ImFont(this_00);
    pIVar4 = GImGui;
    iVar2 = (this->Fonts).Size;
    if (iVar2 == (this->Fonts).Capacity) {
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      iVar8 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (ImFont **)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
      ppIVar10 = (this->Fonts).Data;
      if (ppIVar10 == (ImFont **)0x0) {
LAB_00152ba9:
        ppIVar10 = (ImFont **)0x0;
        pIVar4 = GImGui;
      }
      else {
        memcpy(__dest,ppIVar10,(long)(this->Fonts).Size << 3);
        pIVar4 = GImGui;
        ppIVar10 = (this->Fonts).Data;
        if (ppIVar10 == (ImFont **)0x0) goto LAB_00152ba9;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(pIVar4->IO).MemFreeFn)(ppIVar10);
      (this->Fonts).Data = __dest;
      (this->Fonts).Capacity = iVar8;
      iVar2 = (this->Fonts).Size;
    }
    else {
      __dest = (this->Fonts).Data;
    }
    (this->Fonts).Size = iVar2 + 1;
    __dest[iVar2] = this_00;
  }
  pIVar4 = GImGui;
  iVar2 = (this->ConfigData).Size;
  if (iVar2 == (this->ConfigData).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar8 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar8 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar3 = (ImFontConfig *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 * 0x68);
    pIVar9 = (this->ConfigData).Data;
    if (pIVar9 == (ImFontConfig *)0x0) {
LAB_00152c48:
      pIVar9 = (ImFontConfig *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pIVar3,pIVar9,(long)(this->ConfigData).Size * 0x68);
      pIVar4 = GImGui;
      pIVar9 = (this->ConfigData).Data;
      if (pIVar9 == (ImFontConfig *)0x0) goto LAB_00152c48;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar9);
    (this->ConfigData).Data = pIVar3;
    (this->ConfigData).Capacity = iVar8;
    iVar2 = (this->ConfigData).Size;
  }
  else {
    pIVar3 = (this->ConfigData).Data;
  }
  (this->ConfigData).Size = iVar2 + 1;
  pIVar9 = font_cfg;
  pIVar3 = pIVar3 + iVar2;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    pIVar3->FontData = pIVar9->FontData;
    pIVar9 = (ImFontConfig *)((long)pIVar9 + (ulong)bVar11 * -0x10 + 8);
    pIVar3 = (ImFontConfig *)((long)pIVar3 + (ulong)bVar11 * -0x10 + 8);
  }
  lVar7 = (long)(this->ConfigData).Size;
  if (lVar7 < 1) {
    __function = "value_type &ImVector<ImFontConfig>::back() [T = ImFontConfig]";
LAB_00152d64:
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x35d,__function);
  }
  pIVar3 = (this->ConfigData).Data;
  if (pIVar3[lVar7 + -1].DstFont == (ImFont *)0x0) {
    lVar5 = (long)(this->Fonts).Size;
    if (lVar5 < 1) {
      __function = "value_type &ImVector<ImFont *>::back() [T = ImFont *]";
      goto LAB_00152d64;
    }
    pIVar3[lVar7 + -1].DstFont = (this->Fonts).Data[lVar5 + -1];
  }
  pIVar4 = GImGui;
  if (pIVar3[lVar7 + -1].FontDataOwnedByAtlas == false) {
    iVar2 = pIVar3[lVar7 + -1].FontDataSize;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest_00 = (*(pIVar4->IO).MemAllocFn)((long)iVar2);
    pIVar3[lVar7 + -1].FontData = __dest_00;
    pIVar3[lVar7 + -1].FontDataOwnedByAtlas = true;
    memcpy(__dest_00,font_cfg->FontData,(long)pIVar3[lVar7 + -1].FontDataSize);
  }
  ClearTexData(this);
  return pIVar3[lVar7 + -1].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
    {
        ImFont* font = (ImFont*)ImGui::MemAlloc(sizeof(ImFont));
        IM_PLACEMENT_NEW(font) ImFont();
        Fonts.push_back(font);
    }

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
	if (!new_font_cfg.DstFont)
	    new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}